

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Miter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char **__filename;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  Gia_Man_t *p1;
  Gia_Man_t *pNew;
  char *pcVar7;
  uint local_80;
  int fVerbose;
  int fTransZ;
  int fConvert;
  int fTransX;
  int fTrans;
  int fSeq;
  int fDualOut;
  int nInsDup;
  int c;
  int nArgcNew;
  char **pArgvNew;
  char *pTemp;
  char *FileName;
  Gia_Man_t *pSecond;
  Gia_Man_t *pAux;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fSeq = 0;
  fTrans = 0;
  fTransX = 0;
  bVar1 = false;
  bVar2 = false;
  bVar4 = false;
  bVar3 = false;
  local_80 = 0;
  Extra_UtilGetoptReset();
  do {
    iVar5 = Extra_UtilGetopt(argc,argv,"Idstxyzvh");
    if (iVar5 == -1) {
      if ((((bVar1) || (bVar2)) || (bVar3)) || (bVar4)) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Miter(): There is no AIG.\n");
          return 1;
        }
        uVar6 = Gia_ManPoNum(pAbc->pGia);
        if ((uVar6 & 1) == 1) {
          Abc_Print(-1,"Abc_CommandAbc9Miter(): The number of outputs should be even.\n");
          return 0;
        }
        if (bVar1) {
          pSecond = Gia_ManTransformMiter(pAbc->pGia);
          Abc_Print(1,"The miter (current AIG) is transformed by XORing POs pair-wise.\n");
        }
        else if (bVar2) {
          pSecond = Gia_ManTransformMiter2(pAbc->pGia);
          Abc_Print(1,
                    "The miter (current AIG) is transformed by XORing POs of two word-level outputs.\n"
                   );
        }
        else if (bVar3) {
          pSecond = Gia_ManTransformDualOutput(pAbc->pGia);
          Abc_Print(1,"The dual-output miter (current AIG) is transformed by ordering sides.\n");
        }
        else {
          pSecond = Gia_ManTransformTwoWord2DualOutput(pAbc->pGia);
          Abc_Print(1,"The miter (current AIG) is transformed from two-word to dual-output.\n");
        }
        Abc_FrameUpdateGia(pAbc,pSecond);
        return 0;
      }
      if (argc - globalUtilOptind != 1) {
        Abc_Print(-1,"File name is not given on the command line.\n");
        return 1;
      }
      __filename = (char **)argv[globalUtilOptind];
      for (pArgvNew = __filename; *(char *)pArgvNew != '\0';
          pArgvNew = (char **)((long)pArgvNew + 1)) {
        if (*(char *)pArgvNew == '>') {
          *(undefined1 *)pArgvNew = 0x5c;
        }
      }
      __stream = fopen((char *)__filename,"r");
      if (__stream == (FILE *)0x0) {
        Abc_Print(-1,"Cannot open input file \"%s\". ",__filename);
        pcVar7 = Extra_FileGetSimilarName
                           ((char *)__filename,".aig",(char *)0x0,(char *)0x0,(char *)0x0,
                            (char *)0x0);
        if (pcVar7 != (char *)0x0) {
          Abc_Print(1,"Did you mean \"%s\"?",pcVar7);
        }
        Abc_Print(1,"\n");
        return 1;
      }
      fclose(__stream);
      p1 = Gia_AigerRead((char *)__filename,0,0,0);
      if (p1 == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Reading AIGER has failed.\n");
        return 0;
      }
      pNew = Gia_ManMiter(pAbc->pGia,p1,fSeq,fTrans,fTransX,0,local_80);
      Gia_ManStop(p1);
      Abc_FrameUpdateGia(pAbc,pNew);
      return 0;
    }
    switch(iVar5) {
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by a char string.\n");
        goto LAB_002a8599;
      }
      fSeq = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fSeq < 0) {
LAB_002a8599:
        Abc_Print(-2,"usage: &miter [-I num] [-dstxyzvh] <file>\n");
        Abc_Print(-2,"\t         creates miter of two designs (current AIG vs. <file>)\n");
        Abc_Print(-2,"\t-I num : the number of last PIs to replicate [default = %d]\n",
                  (ulong)(uint)fSeq);
        pcVar7 = "no";
        if (fTrans != 0) {
          pcVar7 = "yes";
        }
        Abc_Print(-2,"\t-d     : toggle creating dual-output miter [default = %s]\n",pcVar7);
        pcVar7 = "no";
        if (fTransX != 0) {
          pcVar7 = "yes";
        }
        Abc_Print(-2,"\t-s     : toggle creating sequential miter [default = %s]\n",pcVar7);
        pcVar7 = "no";
        if (bVar1) {
          pcVar7 = "yes";
        }
        Abc_Print(-2,"\t-t     : toggle XORing POs of dual-output miter [default = %s]\n",pcVar7);
        pcVar7 = "no";
        if (bVar2) {
          pcVar7 = "yes";
        }
        Abc_Print(-2,"\t-x     : toggle XORing POs of two-word miter [default = %s]\n",pcVar7);
        pcVar7 = "no";
        if (bVar4) {
          pcVar7 = "yes";
        }
        Abc_Print(-2,
                  "\t-y     : toggle convering two-word miter into dual-output miter [default = %s]\n"
                  ,pcVar7);
        pcVar7 = "no";
        if (bVar3) {
          pcVar7 = "yes";
        }
        Abc_Print(-2,"\t-z     : toggle odering sides of the dual-output miter [default = %s]\n",
                  pcVar7);
        pcVar7 = "no";
        if (local_80 != 0) {
          pcVar7 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        Abc_Print(-2,"\t<file> : AIGER file with the design to miter\n");
        return 1;
      }
      break;
    default:
      goto LAB_002a8599;
    case 100:
      fTrans = fTrans ^ 1;
      break;
    case 0x68:
      goto LAB_002a8599;
    case 0x73:
      fTransX = fTransX ^ 1;
      break;
    case 0x74:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x76:
      local_80 = local_80 ^ 1;
      break;
    case 0x78:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x79:
      bVar4 = (bool)(bVar4 ^ 1);
      break;
    case 0x7a:
      bVar3 = (bool)(bVar3 ^ 1);
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Miter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Gia_Man_t * pAux;
    Gia_Man_t * pSecond;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int nArgcNew;
    int c;
    int nInsDup  = 0;
    int fDualOut = 0;
    int fSeq     = 0;
    int fTrans   = 0;
    int fTransX  = 0;
    int fConvert = 0;
    int fTransZ  = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Idstxyzvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by a char string.\n" );
                goto usage;
            }
            nInsDup = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInsDup < 0 )
                goto usage;
            break;
        case 'd':
            fDualOut ^= 1;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 't':
            fTrans ^= 1;
            break;
        case 'x':
            fTransX ^= 1;
            break;
        case 'y':
            fConvert ^= 1;
            break;
        case 'z':
            fTransZ ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fTrans || fTransX || fTransZ || fConvert )
    {
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Miter(): There is no AIG.\n" );
            return 1;
        }
        if ( (Gia_ManPoNum(pAbc->pGia) & 1) == 1 )
        {
            Abc_Print( -1, "Abc_CommandAbc9Miter(): The number of outputs should be even.\n" );
            return 0;
        }
        if ( fTrans )
        {
            pAux = Gia_ManTransformMiter( pAbc->pGia );
            Abc_Print( 1, "The miter (current AIG) is transformed by XORing POs pair-wise.\n" );
        }
        else if ( fTransX )
        {
            pAux = Gia_ManTransformMiter2( pAbc->pGia );
            Abc_Print( 1, "The miter (current AIG) is transformed by XORing POs of two word-level outputs.\n" );
        }
        else if ( fTransZ ) 
        {
            extern Gia_Man_t * Gia_ManTransformDualOutput( Gia_Man_t * p );
            pAux = Gia_ManTransformDualOutput( pAbc->pGia );
            Abc_Print( 1, "The dual-output miter (current AIG) is transformed by ordering sides.\n" );
        }
        else
        {
            pAux = Gia_ManTransformTwoWord2DualOutput( pAbc->pGia );
            Abc_Print( 1, "The miter (current AIG) is transformed from two-word to dual-output.\n" );
        }
        Abc_FrameUpdateGia( pAbc, pAux );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
    if ( pSecond == NULL )
    {
        Abc_Print( -1, "Reading AIGER has failed.\n" );
        return 0;
    }
    // compute the miter
    pAux = Gia_ManMiter( pAbc->pGia, pSecond, nInsDup, fDualOut, fSeq, 0, fVerbose );
    Gia_ManStop( pSecond );
    Abc_FrameUpdateGia( pAbc, pAux );
    return 0;

usage:
    Abc_Print( -2, "usage: &miter [-I num] [-dstxyzvh] <file>\n" );
    Abc_Print( -2, "\t         creates miter of two designs (current AIG vs. <file>)\n" );
    Abc_Print( -2, "\t-I num : the number of last PIs to replicate [default = %d]\n", nInsDup );
    Abc_Print( -2, "\t-d     : toggle creating dual-output miter [default = %s]\n", fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle creating sequential miter [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle XORing POs of dual-output miter [default = %s]\n", fTrans? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle XORing POs of two-word miter [default = %s]\n", fTransX? "yes": "no" );
    Abc_Print( -2, "\t-y     : toggle convering two-word miter into dual-output miter [default = %s]\n", fConvert? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle odering sides of the dual-output miter [default = %s]\n", fTransZ? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : AIGER file with the design to miter\n");
    return 1;
}